

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall Js::ScriptContext::ClearRejitReasonCountsArray(ScriptContext *this)

{
  uint *puVar1;
  long lVar2;
  
  puVar1 = this->rejitReasonCounts;
  if (puVar1 != (uint *)0x0) {
    for (lVar2 = 0; lVar2 != 0x2d; lVar2 = lVar2 + 1) {
      puVar1[lVar2] = 0;
    }
  }
  puVar1 = this->rejitReasonCountsCap;
  if (puVar1 != (uint *)0x0) {
    for (lVar2 = 0; lVar2 != 0x2d; lVar2 = lVar2 + 1) {
      puVar1[lVar2] = 0;
    }
  }
  return;
}

Assistant:

void ScriptContext::ClearRejitReasonCountsArray()
    {
        if (this->rejitReasonCounts != nullptr)
        {
            for (UINT16 i = 0; i < NumRejitReasons; i++)
            {
                this->rejitReasonCounts[i] = 0;
            }
        }
        if (this->rejitReasonCountsCap != nullptr)
        {
            for (UINT16 i = 0; i < NumRejitReasons; i++)
            {
                this->rejitReasonCountsCap[i] = 0;
            }
        }
    }